

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::TransitionBufferState
          (DeviceContextVkImpl *this,BufferVkImpl *BufferVk,RESOURCE_STATE OldState,
          RESOURCE_STATE NewState,bool UpdateBufferState)

{
  undefined *puVar1;
  bool bVar2;
  RESOURCE_STATE RVar3;
  VkPipelineStageFlags srcAccessMask;
  VkPipelineStageFlags dstAccessMask;
  VkPipelineStageFlags SrcStages;
  VkPipelineStageFlags DstStages;
  RenderPassVkImpl *pRVar4;
  Char *pCVar5;
  BufferDesc *pBVar6;
  undefined8 uVar7;
  VkBuffer_T *pVVar8;
  size_t sVar9;
  undefined4 in_register_0000000c;
  char (*Args_1) [39];
  RESOURCE_STATE State;
  RESOURCE_STATE State_00;
  undefined7 in_register_00000081;
  char (*Args_2) [70];
  char (*in_stack_fffffffffffffe88) [26];
  VkPipelineStageFlags NewStages;
  VkPipelineStageFlags OldStages;
  VkPipelineStageFlags NewAccessFlags;
  VkPipelineStageFlags OldAccessFlags;
  string msg_2;
  string msg_1;
  undefined1 local_d8 [7];
  bool AfterWrite;
  String local_b8;
  undefined1 local_98 [8];
  string _msg_1;
  string _msg;
  undefined1 local_48 [8];
  string msg;
  RESOURCE_STATE RStack_1c;
  bool UpdateBufferState_local;
  RESOURCE_STATE NewState_local;
  RESOURCE_STATE OldState_local;
  BufferVkImpl *BufferVk_local;
  DeviceContextVkImpl *this_local;
  
  Args_2 = (char (*) [70])CONCAT71(in_register_00000081,UpdateBufferState);
  Args_1 = (char (*) [39])CONCAT44(in_register_0000000c,NewState);
  msg.field_2._M_local_buf[0xf] = UpdateBufferState;
  pRVar4 = Diligent::RefCntAutoPtr::operator_cast_to_RenderPassVkImpl_
                     ((RefCntAutoPtr *)
                      &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                       super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pActiveRenderPass);
  if (pRVar4 != (RenderPassVkImpl *)0x0) {
    FormatString<char[55]>
              ((string *)local_48,
               (char (*) [55])"State transitions are not allowed inside a render pass");
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    Args_1 = (char (*) [39])0xc46;
    DebugAssertionFailed
              (pCVar5,"TransitionBufferState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xc46);
    std::__cxx11::string::~string((string *)local_48);
  }
  if (OldState == RESOURCE_STATE_UNKNOWN) {
    bVar2 = BufferBase<Diligent::EngineVkImplTraits>::IsInKnownState
                      (&BufferVk->super_BufferBase<Diligent::EngineVkImplTraits>);
    if (!bVar2) {
      pBVar6 = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
               ::GetDesc((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                          *)BufferVk);
      FormatString<char[43],char_const*,char[70]>
                ((string *)((long)&_msg_1.field_2 + 8),
                 (Diligent *)"Failed to transition the state of buffer \'",(char (*) [43])pBVar6,
                 (char **)"\' because the buffer state is unknown and is not explicitly specified",
                 Args_2);
      puVar1 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar7 = std::__cxx11::string::c_str();
        (*(code *)puVar1)(2,uVar7,0);
      }
      std::__cxx11::string::~string((string *)(_msg_1.field_2._M_local_buf + 8));
      return;
    }
    RStack_1c = BufferBase<Diligent::EngineVkImplTraits>::GetState
                          (&BufferVk->super_BufferBase<Diligent::EngineVkImplTraits>);
  }
  else {
    bVar2 = BufferBase<Diligent::EngineVkImplTraits>::IsInKnownState
                      (&BufferVk->super_BufferBase<Diligent::EngineVkImplTraits>);
    RStack_1c = OldState;
    if ((bVar2) &&
       (RVar3 = BufferBase<Diligent::EngineVkImplTraits>::GetState
                          (&BufferVk->super_BufferBase<Diligent::EngineVkImplTraits>),
       RVar3 != OldState)) {
      RVar3 = BufferBase<Diligent::EngineVkImplTraits>::GetState
                        (&BufferVk->super_BufferBase<Diligent::EngineVkImplTraits>);
      GetResourceStateString_abi_cxx11_(&local_b8,(Diligent *)(ulong)RVar3,State);
      pBVar6 = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
               ::GetDesc((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                          *)BufferVk);
      GetResourceStateString_abi_cxx11_((String *)local_d8,(Diligent *)(ulong)OldState,State_00);
      Args_1 = (char (*) [39])0xe36fd5;
      FormatString<char[11],std::__cxx11::string,char[13],char_const*,char[32],std::__cxx11::string,char[26]>
                ((string *)local_98,(Diligent *)"The state ",(char (*) [11])&local_b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xe36fd5,
                 (char (*) [13])pBVar6,(char **)"\' does not match the old state ",
                 (char (*) [32])local_d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 " specified by the barrier",in_stack_fffffffffffffe88);
      std::__cxx11::string::~string((string *)local_d8);
      std::__cxx11::string::~string((string *)&local_b8);
      puVar1 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar7 = std::__cxx11::string::c_str();
        Args_1 = (char (*) [39])0x0;
        (*(code *)puVar1)(2,uVar7,0);
      }
      std::__cxx11::string::~string((string *)local_98);
    }
  }
  bVar2 = anon_unknown_511::ResourceStateHasWriteAccess(RStack_1c);
  RVar3 = Diligent::operator&(RStack_1c,NewState);
  if ((RVar3 != NewState) || (bVar2)) {
    pVVar8 = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkBuffer_T_
                       ((VulkanObjectWrapper *)&BufferVk->m_VulkanBuffer);
    if (pVVar8 == (VkBuffer_T *)0x0) {
      FormatString<char[38]>
                ((string *)((long)&msg_2.field_2 + 8),
                 (char (*) [38])"Cannot transition suballocated buffer");
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      Args_1 = (char (*) [39])0xc62;
      DebugAssertionFailed
                (pCVar5,"TransitionBufferState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0xc62);
      std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
    }
    sVar9 = GetDynamicBufferOffset(this,BufferVk,true);
    if (sVar9 != 0) {
      FormatString<char[26],char[39]>
                ((string *)&NewAccessFlags,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"GetDynamicBufferOffset(&BufferVk) == 0",Args_1);
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"TransitionBufferState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0xc63);
      std::__cxx11::string::~string((string *)&NewAccessFlags);
    }
    EnsureVkCmdBuffer(this);
    srcAccessMask = ResourceStateFlagsToVkAccessFlags(RStack_1c);
    dstAccessMask = ResourceStateFlagsToVkAccessFlags(NewState);
    SrcStages = ResourceStateFlagsToVkPipelineStageFlags(RStack_1c);
    DstStages = ResourceStateFlagsToVkPipelineStageFlags(NewState);
    VulkanUtilities::VulkanCommandBuffer::MemoryBarrier
              (&this->m_CommandBuffer,srcAccessMask,dstAccessMask,SrcStages,DstStages);
    if ((msg.field_2._M_local_buf[0xf] & 1U) != 0) {
      BufferBase<Diligent::EngineVkImplTraits>::SetState
                (&BufferVk->super_BufferBase<Diligent::EngineVkImplTraits>,NewState);
    }
  }
  return;
}

Assistant:

void DeviceContextVkImpl::TransitionBufferState(BufferVkImpl& BufferVk, RESOURCE_STATE OldState, RESOURCE_STATE NewState, bool UpdateBufferState)
{
    VERIFY(m_pActiveRenderPass == nullptr, "State transitions are not allowed inside a render pass");
    if (OldState == RESOURCE_STATE_UNKNOWN)
    {
        if (BufferVk.IsInKnownState())
        {
            OldState = BufferVk.GetState();
        }
        else
        {
            LOG_ERROR_MESSAGE("Failed to transition the state of buffer '", BufferVk.GetDesc().Name, "' because the buffer state is unknown and is not explicitly specified");
            return;
        }
    }
    else
    {
        if (BufferVk.IsInKnownState() && BufferVk.GetState() != OldState)
        {
            LOG_ERROR_MESSAGE("The state ", GetResourceStateString(BufferVk.GetState()), " of buffer '",
                              BufferVk.GetDesc().Name, "' does not match the old state ", GetResourceStateString(OldState),
                              " specified by the barrier");
        }
    }

    // Always add barrier after writes.
    const bool AfterWrite = ResourceStateHasWriteAccess(OldState);

    if (((OldState & NewState) != NewState) || AfterWrite)
    {
        DEV_CHECK_ERR(BufferVk.m_VulkanBuffer != VK_NULL_HANDLE, "Cannot transition suballocated buffer");
        VERIFY_EXPR(GetDynamicBufferOffset(&BufferVk) == 0);

        EnsureVkCmdBuffer();
        VkPipelineStageFlags OldAccessFlags = ResourceStateFlagsToVkAccessFlags(OldState);
        VkPipelineStageFlags NewAccessFlags = ResourceStateFlagsToVkAccessFlags(NewState);
        VkPipelineStageFlags OldStages      = ResourceStateFlagsToVkPipelineStageFlags(OldState);
        VkPipelineStageFlags NewStages      = ResourceStateFlagsToVkPipelineStageFlags(NewState);
        m_CommandBuffer.MemoryBarrier(OldAccessFlags, NewAccessFlags, OldStages, NewStages);
        if (UpdateBufferState)
        {
            BufferVk.SetState(NewState);
        }
    }
}